

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O3

void __thiscall
solitaire::graphics::Renderer::renderStockPileUncoveredCards
          (Renderer *this,Cards *pileCards,SelectedCardIndex *selectedCardIndex,
          StockPileCollider *collider)

{
  int iVar1;
  Position local_30;
  
  if ((selectedCardIndex->super__Optional_base<unsigned_int,_true,_true>)._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged == true) {
    local_30.x = 0x69;
    local_30.y = 0x1e;
    iVar1 = (*collider->_vptr_StockPileCollider[5])(collider);
    if (0x68 < iVar1) {
      do {
        if ((selectedCardIndex->super__Optional_base<unsigned_int,_true,_true>)._M_payload.
            super__Optional_payload_base<unsigned_int>._M_engaged == false) {
          std::__throw_bad_optional_access();
        }
        renderCard(this,&local_30,
                   (pileCards->
                   super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                   )._M_impl.super__Vector_impl_data._M_start +
                   (selectedCardIndex->super__Optional_base<unsigned_int,_true,_true>)._M_payload.
                   super__Optional_payload_base<unsigned_int>._M_payload._M_value);
        local_30.x = local_30.x + 2;
      } while (local_30.x <= iVar1);
    }
  }
  return;
}

Assistant:

void Renderer::renderStockPileUncoveredCards(
    const Cards& pileCards, const SelectedCardIndex& selectedCardIndex,
    const StockPileCollider& collider) const
{
    if (not selectedCardIndex) return;

    auto cardPosition = Layout::stockPilePosition;
    cardPosition.x += Layout::pilesSpacing;
    const auto uncoveredCardsPosition = collider.getUncoveredCardsPosition();

    while (cardPosition.x <= uncoveredCardsPosition.x) {
        renderCard(cardPosition, pileCards[selectedCardIndex.value()]);
        cardPosition.x += Layout::stockPileCardsSpacing;
    }
}